

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator * __thiscall
QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>>::
emplace_helper<std::pair<unsigned_int,QMetaObject_const*>>
          (QMultiHash<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_> *this,QObject **key,
          pair<unsigned_int,_const_QMetaObject_*> *args)

{
  long lVar1;
  piter it;
  Data<QHashPrivate::MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>_> *in_RCX;
  Data<QHashPrivate::MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>_> *in_RDX;
  iterator *in_RSI;
  iterator *in_RDI;
  long in_FS_OFFSET;
  InsertionResult result;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<QObject*,std::pair<unsigned_int,QMetaObject_const*>>>::
  findOrInsert<QObject*>(in_RDX,(QObject **)in_RCX);
  QHashPrivate::
  iterator<QHashPrivate::MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>_>::node
            ((iterator<QHashPrivate::MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>_>
              *)in_RCX);
  QHashPrivate::MultiNode<QObject*,std::pair<unsigned_int,QMetaObject_const*>>::
  createInPlace<std::pair<unsigned_int,QMetaObject_const*>>
            ((MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_> *)in_RCX,
             (QObject **)in_RSI,(pair<unsigned_int,_const_QMetaObject_*> *)in_RDI);
  (in_RSI->i).bucket = (in_RSI->i).bucket + 1;
  it.bucket = (size_t)in_RDX;
  it.d = in_RCX;
  QMultiHash<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>::iterator::iterator
            (in_RSI,it,(Chain **)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&...args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->insertMulti(std::forward<Args>(args)...);
        ++m_size;
        return iterator(result.it);
    }